

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domains.c
# Opt level: O2

double * append_domain_coords_face
                   (int dom,int order,double *ptr,int *global_index,int *edges,int *tri,int ntri)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  double dVar6;
  undefined1 auVar5 [16];
  
  if (order == 3) {
    uVar4 = 0;
    uVar2 = (ulong)(uint)ntri;
    if (ntri < 1) {
      uVar2 = uVar4;
    }
    for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
      auVar5 = ZEXT816(0);
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        dVar6 = auVar5._8_8_;
        auVar5._0_8_ = auVar5._0_8_ +
                       global_coords[(long)global_index[edges[(long)tri[lVar3] * 2]] * 2] +
                       global_coords[(long)global_index[edges[tri[lVar3] * 2 + 1]] * 2];
        auVar5._8_8_ = dVar6 + global_coords
                               [(long)global_index[edges[(long)tri[lVar3] * 2]] * 2 + 1] +
                       global_coords[(long)global_index[edges[tri[lVar3] * 2 + 1]] * 2 + 1];
      }
      auVar5 = divpd(auVar5,_DAT_00111010);
      uVar1 = ((uint)uVar4 & 3) << 3;
      dVar6 = *(double *)(&DAT_001111a8 + uVar1);
      *ptr = *(double *)(&DAT_00111188 + uVar1) + auVar5._0_8_;
      ptr[1] = dVar6 + auVar5._8_8_;
      ptr = ptr + 2;
      printf("%lg %lg 0. %d\n",(ulong)(uint)dom);
      tri = tri + 3;
    }
  }
  return ptr;
}

Assistant:

double *
append_domain_coords_face(int dom, int order, double *ptr,
                          const int *global_index,
                          const int *edges, const int *tri, int ntri) {
  int i,j,v0,v1;
  double pt[2], xoffset = 0., yoffset = 0., travel = 0.01;
  if(order == 3) {
    for(i = 0; i < ntri; ++i) {
      pt[0] = pt[1] = 0.;
      for(j = 0; j < 3; ++j) {
        /* Current edge in tri*/
        int edge = tri[3*i+j];

        /* vertex indices of edge endpoints */
        v0 = global_index[edges[2*edge]];
        v1 = global_index[edges[2*edge+1]];

        pt[0] += global_coords[v0*2+0];
        pt[1] += global_coords[v0*2+1];
        pt[0] += global_coords[v1*2+0];
        pt[1] += global_coords[v1*2+1];
      }
      /* triangle center. */
      pt[0] /= 6.;
      pt[1] /= 6.;

      switch(i%4) {
      case 0: xoffset = -travel; yoffset = 0.;      break;
      case 1: xoffset = 0.;      yoffset = -travel; break;
      case 2: xoffset = travel;  yoffset = 0.;      break;
      case 3: xoffset = 0.;      yoffset = travel;  break;
      }

      /* perturb the point. */
      pt[0] += xoffset;
      pt[1] += yoffset;

      *ptr++ = pt[0];
      *ptr++ = pt[1];

      /* Print value to Point3D output. */
      printf("%lg %lg 0. %d\n", pt[0],pt[1], dom);
    }
  }
  return ptr;
}